

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstrmatrixflowtbb.cpp
# Opt level: O1

void __thiscall
TPZStructMatrixTBBFlow<std::complex<double>_>::Assemble
          (TPZStructMatrixTBBFlow<std::complex<double>_> *this,TPZBaseMatrix *stiffness,
          TPZBaseMatrix *rhs,TPZAutoPointer<TPZGuiInterface> *guiInterface)

{
  long lVar1;
  complex<double> *__s;
  ulong uVar2;
  long lVar3;
  TPZAutoPointer<TPZGuiInterface> local_e8;
  TPZAutoPointer<TPZGuiInterface> local_e0;
  long local_d8;
  long local_d0;
  TPZBaseMatrix *local_c8;
  TPZFMatrix<std::complex<double>_> local_c0;
  
  lVar1 = __dynamic_cast(this,&TPZStructMatrixTBBFlow<std::complex<double>>::typeinfo,
                         &TPZStructMatrix::typeinfo,0xfffffffffffffffe);
  if (ass_stiff.filename.
      super_argT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
      super_arg_base.arg_set == true) {
    ass_stiff.stats_recorded = true;
    RunStatsRecorder::start(&ass_stiff.stats);
  }
  if (*(char *)(lVar1 + 0x58) == '\x01') {
    lVar3 = *(long *)(lVar1 + 0x70);
    local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow = 0;
    local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol = 0;
    local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_01841760;
    local_c0.fElem = (complex<double> *)0x0;
    local_c0.fGiven = (complex<double> *)0x0;
    local_c0.fSize = 0;
    local_c8 = stiffness;
    TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
    local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
    local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
    local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01840c80;
    local_c0.fWork.fStore = (complex<double> *)0x0;
    local_c0.fWork.fNElements = 0;
    local_c0.fWork.fNAlloc = 0;
    if (*(char *)((long)&(this->fFlowGraph).fRef + *(long *)(*(long *)this + -0x60) + 4) == '\x01')
    {
      local_d0 = rhs->fCol;
      uVar2 = local_d0 * lVar3;
      if (uVar2 - local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol *
                  local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow != 0) {
        local_d8 = lVar3;
        if ((local_c0.fElem != (complex<double> *)0x0) && (local_c0.fElem != local_c0.fGiven)) {
          operator_delete__(local_c0.fElem);
        }
        if ((local_c0.fGiven == (complex<double> *)0x0) ||
           (__s = local_c0.fGiven, uVar2 - local_c0.fSize != 0 && local_c0.fSize <= (long)uVar2)) {
          if (uVar2 == 0) {
            __s = (complex<double> *)0x0;
          }
          else {
            __s = (complex<double> *)operator_new__(-(ulong)(uVar2 >> 0x3c != 0) | uVar2 * 0x10);
            memset(__s,0,uVar2 * 0x10);
          }
        }
        lVar3 = local_d8;
        local_c0.fElem = __s;
        if (__s == (complex<double> *)0x0 && uVar2 != 0) {
          TPZFMatrix<std::complex<double>_>::Error("Resize <memory allocation error>.",(char *)0x0);
        }
      }
      local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol = local_d0;
      local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow = lVar3;
      (*local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0xf])();
    }
    local_e0 = (TPZAutoPointer<TPZGuiInterface>)guiInterface->fRef;
    LOCK();
    ((local_e0.fRef)->fCounter).super___atomic_base<int>._M_i =
         ((local_e0.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
    UNLOCK();
    (**(code **)(*(long *)this + 0x68))(this,local_c8,&local_c0);
    TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer(&local_e0);
    if (*(char *)((long)&(this->fFlowGraph).fRef + *(long *)(*(long *)this + -0x60) + 4) == '\x01')
    {
      TPZEquationFilter::Scatter((TPZEquationFilter *)(lVar1 + 0x48),(TPZBaseMatrix *)&local_c0,rhs)
      ;
    }
    TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&local_c0);
  }
  else {
    local_e8 = (TPZAutoPointer<TPZGuiInterface>)guiInterface->fRef;
    LOCK();
    ((local_e8.fRef)->fCounter).super___atomic_base<int>._M_i =
         ((local_e8.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
    UNLOCK();
    (**(code **)(*(long *)this + 0x68))(this,stiffness,rhs);
    TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer(&local_e8);
  }
  if (ass_stiff.filename.
      super_argT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
      super_arg_base.arg_set == true) {
    ass_stiff.stats_recorded = true;
    RunStatsRecorder::stop(&ass_stiff.stats);
  }
  return;
}

Assistant:

void TPZStructMatrixTBBFlow<TVar>::Assemble(TPZBaseMatrix & stiffness, TPZBaseMatrix & rhs,TPZAutoPointer<TPZGuiInterface> guiInterface){
    const auto &equationFilter =
        (dynamic_cast<TPZStructMatrix*>(this))->EquationFilter();
    ass_stiff.start();
    if (equationFilter.IsActive()) {
        int64_t neqcondense = equationFilter.NActiveEquations();
#ifdef PZDEBUG
        if (stiffness.Rows() != neqcondense) {
            DebugStop();
        }
#endif
        TPZFMatrix<TVar> rhsloc;
        if(ComputeRhs()) rhsloc.Redim(neqcondense, rhs.Cols());
        this->MultiThread_Assemble(stiffness,rhsloc,guiInterface);
        if(ComputeRhs()) equationFilter.Scatter(rhsloc, rhs);
    }
    else
    {
        this->MultiThread_Assemble(stiffness,rhs,guiInterface);
        
    }
    ass_stiff.stop();
}